

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
gmlc::networking::extractInterfaceAndPort
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,string *address)

{
  ulong __pos;
  int iVar1;
  size_type __n;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->second = 0;
  __n = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,':',
                   0xffffffffffffffff);
  if (__n == 0xffffffffffffffff) {
    std::__cxx11::string::string
              ((string *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address);
  }
  else {
    __pos = __n + 1;
    if ((__pos < address->_M_string_length) && ((address->_M_dataplus)._M_p[__pos] != '/')) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,__pos,
                 0xffffffffffffffff);
      iVar1 = CLI::std::__cxx11::stoi((string *)&local_50,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&local_50);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address,0,__n)
      ;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      __return_storage_ptr__->second = iVar1;
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string
              ((string *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)address);
  }
  local_50.second = -1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  operator=(__return_storage_ptr__,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, int> extractInterfaceAndPort(const std::string& address)
{
    std::pair<std::string, int> ret;
    auto lastColon = address.find_last_of(':');
    if (lastColon == std::string::npos) {
        ret = std::make_pair(address, -1);
    } else {
        try {
            if ((address.size() > lastColon + 1) &&
                (address[lastColon + 1] != '/')) {
                auto val = std::stoi(address.substr(lastColon + 1));
                ret.first = address.substr(0, lastColon);
                ret.second = val;
            } else {
                ret = std::make_pair(address, -1);
            }
        }
        catch (const std::invalid_argument&) {
            ret = std::make_pair(address, -1);
        }
    }

    return ret;
}